

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O0

void glu::parseConfigBitsFromName(RenderConfig *config,char *renderCfgName)

{
  deBool dVar1;
  size_t sVar2;
  InternalError *this;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  int local_2c;
  int ndx_3;
  int ndx_2;
  int ndx_1;
  int ndx;
  char *cfgName;
  char *renderCfgName_local;
  RenderConfig *config_local;
  
  _ndx_1 = renderCfgName;
  cfgName = renderCfgName;
  renderCfgName_local = (char *)config;
  for (ndx_2 = 0; ndx_2 < 5; ndx_2 = ndx_2 + 1) {
    dVar1 = deStringBeginsWith(_ndx_1,parseConfigBitsFromName::colorCfgs[ndx_2].name);
    if (dVar1 != 0) {
      *(int *)(renderCfgName_local + 0x18) = parseConfigBitsFromName::colorCfgs[ndx_2].redBits;
      *(int *)(renderCfgName_local + 0x1c) = parseConfigBitsFromName::colorCfgs[ndx_2].greenBits;
      *(int *)(renderCfgName_local + 0x20) = parseConfigBitsFromName::colorCfgs[ndx_2].blueBits;
      *(int *)(renderCfgName_local + 0x24) = parseConfigBitsFromName::colorCfgs[ndx_2].alphaBits;
      sVar2 = strlen(parseConfigBitsFromName::colorCfgs[ndx_2].name);
      _ndx_1 = _ndx_1 + sVar2;
      break;
    }
  }
  for (ndx_3 = 0; ndx_3 < 4; ndx_3 = ndx_3 + 1) {
    dVar1 = deStringBeginsWith(_ndx_1,parseConfigBitsFromName::depthCfgs[ndx_3].name);
    if (dVar1 != 0) {
      *(int *)(renderCfgName_local + 0x28) = parseConfigBitsFromName::depthCfgs[ndx_3].depthSize;
      sVar2 = strlen(parseConfigBitsFromName::depthCfgs[ndx_3].name);
      _ndx_1 = _ndx_1 + sVar2;
      break;
    }
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    dVar1 = deStringBeginsWith(_ndx_1,parseConfigBitsFromName::stencilCfgs[local_2c].name);
    if (dVar1 != 0) {
      *(int *)(renderCfgName_local + 0x2c) =
           parseConfigBitsFromName::stencilCfgs[local_2c].stencilSize;
      sVar2 = strlen(parseConfigBitsFromName::stencilCfgs[local_2c].name);
      _ndx_1 = _ndx_1 + sVar2;
      break;
    }
  }
  local_30 = 0;
  do {
    if (5 < local_30) {
LAB_010e21ce:
      if (*_ndx_1 != '\0') {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Invalid GL configuration: \'",&local_91);
        std::operator+(&local_70,&local_90,cfgName);
        std::operator+(&local_50,&local_70,"\'");
        tcu::InternalError::InternalError(this,&local_50);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      return;
    }
    dVar1 = deStringBeginsWith(_ndx_1,parseConfigBitsFromName::multiSampleCfgs[local_30].name);
    if (dVar1 != 0) {
      *(int *)(renderCfgName_local + 0x30) =
           parseConfigBitsFromName::multiSampleCfgs[local_30].numSamples;
      sVar2 = strlen(parseConfigBitsFromName::multiSampleCfgs[local_30].name);
      _ndx_1 = _ndx_1 + sVar2;
      goto LAB_010e21ce;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void parseConfigBitsFromName (RenderConfig* config, const char* renderCfgName)
{
	const char*	cfgName	= renderCfgName;

	DE_ASSERT(config->redBits		== RenderConfig::DONT_CARE	&&
			  config->greenBits		== RenderConfig::DONT_CARE	&&
			  config->blueBits		== RenderConfig::DONT_CARE	&&
			  config->alphaBits		== RenderConfig::DONT_CARE	&&
			  config->depthBits		== RenderConfig::DONT_CARE	&&
			  config->stencilBits	== RenderConfig::DONT_CARE	&&
			  config->numSamples	== RenderConfig::DONT_CARE);

	static const struct
	{
		const char*	name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] =
	{
		{ "rgb888",		8, 8, 8, 0 },
		{ "rgba8888",	8, 8, 8, 8 },
		{ "rgb565",		5, 6, 5, 0 },
		{ "rgba4444",	4, 4, 4, 4 },
		{ "rgba5551",	5, 5, 5, 1 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, colorCfgs[ndx].name))
		{
			config->redBits		= colorCfgs[ndx].redBits;
			config->greenBits	= colorCfgs[ndx].greenBits;
			config->blueBits	= colorCfgs[ndx].blueBits;
			config->alphaBits	= colorCfgs[ndx].alphaBits;

			cfgName	+= strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			depthSize;
	} depthCfgs[] =
	{
		{ "d0",		0 },
		{ "d16",	16 },
		{ "d24",	24 },
		{ "d32",	32 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, depthCfgs[ndx].name))
		{
			config->depthBits = depthCfgs[ndx].depthSize;

			cfgName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			stencilSize;
	} stencilCfgs[] =
	{
		{ "s0",		 0 },
		{ "s8",		 8 },
		{ "s16",	16 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, stencilCfgs[ndx].name))
		{
			config->stencilBits = stencilCfgs[ndx].stencilSize;

			cfgName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			numSamples;
	} multiSampleCfgs[] =
	{
		{ "ms0",	 0 },
		{ "ms16",	16 },
		{ "ms1",	 1 },
		{ "ms2",	 2 },
		{ "ms4",	 4 },
		{ "ms8",	 8 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, multiSampleCfgs[ndx].name))
		{
			config->numSamples = multiSampleCfgs[ndx].numSamples;

			cfgName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	if (cfgName[0] != 0)
		throw tcu::InternalError(std::string("Invalid GL configuration: '") + renderCfgName + "'");
}